

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nva.c
# Opt level: O3

int nva_init(void)

{
  uint uVar1;
  long lVar2;
  nva_card *pnVar3;
  int iVar4;
  uint uVar5;
  long lVar6;
  pci_device *ppVar7;
  nva_card *pnVar8;
  long lVar9;
  pci_id_match nv01_match;
  pci_id_match nv_sgs_match;
  pci_id_match nv_match;
  
  iVar4 = pci_system_init();
  if (iVar4 == 0) {
    lVar6 = pci_id_match_iterator_create();
    if (lVar6 != 0) {
      ppVar7 = (pci_device *)pci_device_next(lVar6);
      while (ppVar7 != (pci_device *)0x0) {
        iVar4 = pci_device_probe(ppVar7);
        if (iVar4 == 0) {
          iVar4 = nva_cardsnum;
          if (nva_cardsmax <= nva_cardsnum) {
            iVar4 = nva_cardsmax * 2;
            if (nva_cardsmax == 0) {
              iVar4 = 0x10;
            }
            nva_cardsmax = iVar4;
            nva_cards = (nva_card *)realloc(nva_cards,(long)iVar4 << 5);
            iVar4 = nva_cardsnum;
          }
          pnVar3 = nva_cards;
          nva_cardsnum = iVar4 + 1;
          nva_cards[iVar4].pci = ppVar7;
          pnVar8 = pnVar3 + iVar4;
          pnVar8->boot0 = 0;
          pnVar8->chipset = 0;
          *(undefined8 *)(&pnVar8->boot0 + 2) = 0;
          pnVar3[iVar4].bar0 = (void *)0x0;
        }
        else {
          nva_init_cold_1();
        }
        ppVar7 = (pci_device *)pci_device_next(lVar6);
      }
      pci_iterator_destroy(lVar6);
      lVar6 = pci_id_match_iterator_create();
      if (lVar6 != 0) {
        ppVar7 = (pci_device *)pci_device_next(lVar6);
        while (ppVar7 != (pci_device *)0x0) {
          iVar4 = pci_device_probe(ppVar7);
          if (iVar4 == 0) {
            iVar4 = nva_cardsnum;
            if (nva_cardsmax <= nva_cardsnum) {
              iVar4 = nva_cardsmax * 2;
              if (nva_cardsmax == 0) {
                iVar4 = 0x10;
              }
              nva_cardsmax = iVar4;
              nva_cards = (nva_card *)realloc(nva_cards,(long)iVar4 << 5);
              iVar4 = nva_cardsnum;
            }
            pnVar3 = nva_cards;
            nva_cardsnum = iVar4 + 1;
            nva_cards[iVar4].pci = ppVar7;
            pnVar8 = pnVar3 + iVar4;
            pnVar8->boot0 = 0;
            pnVar8->chipset = 0;
            *(undefined8 *)(&pnVar8->boot0 + 2) = 0;
            pnVar3[iVar4].bar0 = (void *)0x0;
          }
          else {
            nva_init_cold_2();
          }
          ppVar7 = (pci_device *)pci_device_next(lVar6);
        }
        pci_iterator_destroy(lVar6);
        lVar6 = pci_id_match_iterator_create();
        if (lVar6 != 0) {
          ppVar7 = (pci_device *)pci_device_next(lVar6);
          while (ppVar7 != (pci_device *)0x0) {
            iVar4 = pci_device_probe(ppVar7);
            if (iVar4 == 0) {
              iVar4 = nva_cardsnum;
              if (nva_cardsmax <= nva_cardsnum) {
                iVar4 = nva_cardsmax * 2;
                if (nva_cardsmax == 0) {
                  iVar4 = 0x10;
                }
                nva_cardsmax = iVar4;
                nva_cards = (nva_card *)realloc(nva_cards,(long)iVar4 << 5);
                iVar4 = nva_cardsnum;
              }
              pnVar3 = nva_cards;
              nva_cardsnum = iVar4 + 1;
              nva_cards[iVar4].pci = ppVar7;
              pnVar8 = pnVar3 + iVar4;
              pnVar8->boot0 = 0;
              pnVar8->chipset = 0;
              *(undefined8 *)(&pnVar8->boot0 + 2) = 0;
              pnVar3[iVar4].bar0 = (void *)0x0;
            }
            else {
              nva_init_cold_3();
            }
            ppVar7 = (pci_device *)pci_device_next(lVar6);
          }
          pci_iterator_destroy(lVar6);
          if (0 < nva_cardsnum) {
            lVar9 = 0x18;
            lVar6 = 0;
            pnVar8 = nva_cards;
            do {
              lVar2 = *(long *)((long)pnVar8 + lVar9 + -0x18);
              iVar4 = pci_device_map_range
                                (lVar2,*(undefined8 *)(lVar2 + 0x28),*(undefined8 *)(lVar2 + 0x30),1
                                 ,(long)&pnVar8->pci + lVar9);
              pnVar8 = nva_cards;
              if (iVar4 == 0) {
                uVar1 = **(uint **)((long)&nva_cards->pci + lVar9);
                *(uint *)((long)nva_cards + lVar9 + -0x10) = uVar1;
                uVar5 = uVar1 >> 0x14 & 0xff;
                *(uint *)((long)pnVar8 + lVar9 + -0xc) = uVar5;
                if (uVar5 < 0x10) {
                  if ((uVar1 & 0xf000) == 0) {
                    uVar5 = uVar1 >> 0x10 & 0xf;
                    *(uint *)((long)pnVar8 + lVar9 + -0xc) = uVar5;
                    if ((uVar1 & 0xe0) != 0) {
                      *(undefined4 *)((long)pnVar8 + lVar9 + -4) = 1;
                    }
                  }
                  else if ((uVar1 & 0xf00000) == 0) {
                    *(undefined4 *)((long)pnVar8 + lVar9 + -0xc) = 4;
                    uVar5 = 4;
                  }
                  else {
                    *(undefined4 *)((long)pnVar8 + lVar9 + -0xc) = 5;
                    uVar5 = 5;
                  }
                }
                if ((*(short *)(lVar2 + 6) == 0x104a) && (*(short *)(lVar2 + 8) == 9)) {
                  *(undefined4 *)((long)pnVar8 + lVar9 + -0xc) = 1;
                  uVar5 = 1;
                }
                else if (3 < uVar5) {
                  if (uVar5 < 0x10) {
                    *(undefined4 *)((long)pnVar8 + lVar9 + -8) = 4;
                  }
                  else if (uVar5 < 0x20) {
                    *(undefined4 *)((long)pnVar8 + lVar9 + -8) = 0x10;
                  }
                  else if (uVar5 < 0x30) {
                    *(undefined4 *)((long)pnVar8 + lVar9 + -8) = 0x20;
                  }
                  else if (uVar5 < 0x40) {
                    *(undefined4 *)((long)pnVar8 + lVar9 + -8) = 0x30;
                  }
                  else if (uVar5 < 0x50 || (uVar5 & 0xfffffff0) == 0x60) {
                    *(undefined4 *)((long)pnVar8 + lVar9 + -8) = 0x40;
                  }
                  else if (uVar5 < 0xc0) {
                    *(undefined4 *)((long)pnVar8 + lVar9 + -8) = 0x50;
                  }
                  else {
                    *(undefined4 *)((long)pnVar8 + lVar9 + -8) = 0xc0;
                  }
                  goto LAB_00101eea;
                }
                *(uint *)((long)pnVar8 + lVar9 + -8) = uVar5;
              }
              else {
                fprintf(_stderr,"WARN: Can\'t probe %04x:%02x:%02x.%x\n",
                        (ulong)*(uint *)(lVar2 + 0x124),(ulong)*(byte *)(lVar2 + 2),
                        (ulong)*(byte *)(lVar2 + 3),(ulong)*(byte *)(lVar2 + 4));
                pnVar8 = nva_cards;
              }
LAB_00101eea:
              lVar6 = lVar6 + 1;
              lVar9 = lVar9 + 0x20;
            } while (lVar6 < nva_cardsnum);
          }
          return 0;
        }
      }
    }
    pci_system_cleanup();
  }
  return -1;
}

Assistant:

int nva_init() {
	int ret;
	ret = pci_system_init();
	if (ret)
		return -1;
	struct pci_id_match nv_match = {0x10de, PCI_MATCH_ANY, PCI_MATCH_ANY, PCI_MATCH_ANY, 0x30000, 0xffff0000};
	struct pci_device_iterator* it = pci_id_match_iterator_create(&nv_match);
	if (!it) {
		pci_system_cleanup();
		return -1;
	}

	struct pci_device *dev;
	while ((dev = pci_device_next(it))) {
		struct nva_card c = { 0 };
		ret = pci_device_probe(dev);
		if (ret) {
			fprintf (stderr, "WARN: Can't probe %04x:%02x:%02x.%x\n", dev->domain, dev->bus, dev->dev, dev->func);
			continue;
		}
		c.pci = dev;
		ADDARRAY(nva_cards, c);
	}
	pci_iterator_destroy(it);

	struct pci_id_match nv_sgs_match = {0x12d2, PCI_MATCH_ANY, PCI_MATCH_ANY, PCI_MATCH_ANY, 0x30000, 0xffff0000};
	it = pci_id_match_iterator_create(&nv_sgs_match);
	if (!it) {
		pci_system_cleanup();
		return -1;
	}

	while ((dev = pci_device_next(it))) {
		struct nva_card c = { 0 };
		ret = pci_device_probe(dev);
		if (ret) {
			fprintf (stderr, "WARN: Can't probe %04x:%02x:%02x.%x\n", dev->domain, dev->bus, dev->dev, dev->func);
			continue;
		}
		c.pci = dev;
		ADDARRAY(nva_cards, c);
	}
	pci_iterator_destroy(it);

	struct pci_id_match nv01_match = {0x104a, 0x0009, PCI_MATCH_ANY, PCI_MATCH_ANY, 0, 0};
	it = pci_id_match_iterator_create(&nv01_match);
	if (!it) {
		pci_system_cleanup();
		return -1;
	}

	while ((dev = pci_device_next(it))) {
		struct nva_card c = { 0 };
		ret = pci_device_probe(dev);
		if (ret) {
			fprintf (stderr, "WARN: Can't probe %04x:%02x:%02x.%x\n", dev->domain, dev->bus, dev->dev, dev->func);
			continue;
		}
		c.pci = dev;
		ADDARRAY(nva_cards, c);
	}
	pci_iterator_destroy(it);

	int i;
	for (i = 0; i < nva_cardsnum; i++) {
		dev = nva_cards[i].pci;
		ret = pci_device_map_range(dev, dev->regions[0].base_addr, dev->regions[0].size, PCI_DEV_MAP_FLAG_WRITABLE, &nva_cards[i].bar0);
		if (ret) {
			fprintf (stderr, "WARN: Can't probe %04x:%02x:%02x.%x\n", dev->domain, dev->bus, dev->dev, dev->func);
			continue;
		}
		nva_cards[i].boot0 = nva_rd32(i, 0);
		nva_cards[i].chipset = nva_cards[i].boot0 >> 20 & 0xff;
		if (nva_cards[i].chipset < 0x10) {
			if (nva_cards[i].boot0 & 0xf000) {
				if (nva_cards[i].boot0 & 0xf00000)
					nva_cards[i].chipset = 5;
				else
					nva_cards[i].chipset = 4;
			} else {
				nva_cards[i].chipset = nva_cards[i].boot0 >> 16 & 0xf;
				if ((nva_cards[i].boot0 & 0xff) >= 0x20)
					nva_cards[i].is_nv03p = 1;
			}
		}
		if (dev->vendor_id == 0x104a && dev->device_id == 0x0009)
			nva_cards[i].chipset = 0x01;

		if (nva_cards[i].chipset < 0x04)
			nva_cards[i].card_type = nva_cards[i].chipset;
		else if (nva_cards[i].chipset < 0x10)
			nva_cards[i].card_type = 0x04;
		else if (nva_cards[i].chipset < 0x20)
			nva_cards[i].card_type = 0x10;
		else if (nva_cards[i].chipset < 0x30)
			nva_cards[i].card_type = 0x20;
		else if (nva_cards[i].chipset < 0x40)
			nva_cards[i].card_type = 0x30;
		else if (nva_cards[i].chipset < 0x50 ||
			(nva_cards[i].chipset & 0xf0) == 0x60)
			nva_cards[i].card_type = 0x40;
		else if (nva_cards[i].chipset < 0xc0)
			nva_cards[i].card_type = 0x50;
		else
			nva_cards[i].card_type = 0xc0;
	}
	return 0;
}